

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cmTokenize_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string_view str,string_view sep)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_98 [2];
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  size_t local_60;
  size_t local_58;
  size_t local_50;
  size_type local_48;
  size_type tokstart;
  size_type tokend;
  size_t local_30;
  string_view sep_local;
  string_view str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  
  sep_local._M_len = (size_t)sep._M_str;
  local_30 = sep._M_len;
  sep_local._M_str = (char *)str._M_len;
  tokend._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  tokstart = 0;
  do {
    local_58 = local_30;
    local_50 = sep_local._M_len;
    bVar2._M_str = (char *)sep_local._M_len;
    bVar2._M_len = local_30;
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)&sep_local._M_str,
                          bVar2,tokstart);
    if (local_48 == 0xffffffffffffffff) break;
    local_68 = local_30;
    local_60 = sep_local._M_len;
    __str._M_str = (char *)sep_local._M_len;
    __str._M_len = local_30;
    tokstart = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                         ((basic_string_view<char,_std::char_traits<char>_> *)&sep_local._M_str,
                          __str,local_48);
    if (tokstart == 0xffffffffffffffff) {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&sep_local._M_str,
                         local_48,0xffffffffffffffff);
      local_78 = bVar2;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&local_78);
    }
    else {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        ((basic_string_view<char,_std::char_traits<char>_> *)&sep_local._M_str,
                         local_48,tokstart - local_48);
      local_98[0] = bVar2;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,local_98);
    }
  } while (tokstart != 0xffffffffffffffff);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(__return_storage_ptr__);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmTokenize(cm::string_view str, cm::string_view sep)
{
  std::vector<std::string> tokens;
  cm::string_view::size_type tokend = 0;

  do {
    cm::string_view::size_type tokstart = str.find_first_not_of(sep, tokend);
    if (tokstart == cm::string_view::npos) {
      break; // no more tokens
    }
    tokend = str.find_first_of(sep, tokstart);
    if (tokend == cm::string_view::npos) {
      tokens.emplace_back(str.substr(tokstart));
    } else {
      tokens.emplace_back(str.substr(tokstart, tokend - tokstart));
    }
  } while (tokend != cm::string_view::npos);

  if (tokens.empty()) {
    tokens.emplace_back();
  }
  return tokens;
}